

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Color.cpp
# Opt level: O1

string * __thiscall Color::bg_abi_cxx11_(string *__return_storage_ptr__,Color *this)

{
  uint uVar1;
  long lVar2;
  stringstream s;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  uVar1 = this->_value;
  if ((uVar1 >> 0x15 & 1) == 0) {
    lVar2 = 0x28;
    do {
      if (*(uint *)((long)&allColors[0].id + lVar2) == (uVar1 >> 8 & 0xff)) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,*(long *)(&completed_0 + lVar2),
                   *(long *)(lVar2 + 0x114298) + *(long *)(&completed_0 + lVar2));
        return __return_storage_ptr__;
      }
      lVar2 = lVar2 + 0x30;
    } while (lVar2 != 0x1d8);
  }
  else if ((uVar1 >> 0x14 & 1) != 0) {
    std::__cxx11::stringstream::stringstream(local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>(local_190,"color",5);
    std::ostream::_M_insert<unsigned_long>((ulong)local_190);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1a0);
    std::ios_base::~ios_base(local_120);
    return __return_storage_ptr__;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  return __return_storage_ptr__;
}

Assistant:

std::string Color::bg () const
{
#ifdef FEATURE_COLOR
  int index = (_value & _COLOR_BG) >> 8;

  if (_value & _COLOR_256)
  {
    if (_value & _COLOR_HASBG)
    {
      std::stringstream s;
      s << "color" << ((_value & _COLOR_BG) >> 8);
      return s.str ();
    }
  }
  else
  {
    for (unsigned int i = 0; i < NUM_COLORS; ++i)
      if (allColors[i].index == index)
        return allColors[i].english_name;
  }
#endif

  return "";
}